

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_pgroup_sync(Integer grp_id)

{
  long in_RDI;
  int p;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  if (in_RDI < 1) {
    ARMCI_AllFence();
    pnga_msg_pgroup_sync(CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    if (GA_fence_set != 0) {
      memset(fence_array,0,(long)(int)GAnproc);
    }
  }
  else {
    for (iVar1 = 0; iVar1 < PGRP_LIST[in_RDI].map_nproc; iVar1 = iVar1 + 1) {
      ARMCI_Absolute_id((ARMCI_Group *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                        in_stack_ffffffffffffffec);
      ARMCI_Fence(0);
    }
    pnga_msg_pgroup_sync(CONCAT44(iVar1,in_stack_fffffffffffffff0));
    if (GA_fence_set != 0) {
      memset(fence_array,0,(long)(int)GAnproc);
    }
  }
  GA_fence_set = 0;
  return;
}

Assistant:

void pnga_pgroup_sync(Integer grp_id)
{
#ifdef CHECK_MA
  Integer status;
#endif

  /*    printf("p[%d] calling ga_pgroup_sync on group: %d\n",GAme,*grp_id); */
#ifdef USE_ARMCI_GROUP_FENCE
    int grp = (int)grp_id;
    ARMCI_GroupFence(&grp);
    pnga_msg_pgroup_sync(grp_id);
#else
  if (grp_id > 0) {
#   ifdef MSG_COMMS_MPI
    /* fence on all processes in this group */
    { int p; for(p=0;p<PGRP_LIST[grp_id].map_nproc;p++)
      ARMCI_Fence(ARMCI_Absolute_id(&PGRP_LIST[grp_id].group, p)); }
    pnga_msg_pgroup_sync(grp_id);
    if(GA_fence_set)bzero(fence_array,(int)GAnproc);
    GA_fence_set=0;
#   else
    pnga_error("ga_pgroup_sync_(): MPI not defined. ga_msg_pgroup_sync_()  can be called only if GA is built with MPI", 0);
#   endif
  } else {
    /* printf("p[%d] calling regular sync in ga_pgroup_sync\n",GAme); */
    ARMCI_AllFence();
    pnga_msg_pgroup_sync(grp_id);
    if(GA_fence_set)bzero(fence_array,(int)GAnproc);
    GA_fence_set=0;
  }
#endif
#ifdef CHECK_MA
  status = MA_verify_allocator_stuff();
#endif
}